

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::IteratorIndexMethod::~IteratorIndexMethod(IteratorIndexMethod *this)

{
  SystemSubroutine::~SystemSubroutine(&this->super_SystemSubroutine);
  operator_delete(this,0x38);
  return;
}

Assistant:

IteratorIndexMethod() : SystemSubroutine(KnownSystemName::Index, SubroutineKind::Function) {}